

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void ProcessReleaseList(SstStream Stream,ReturnMetadataInfo Metadata)

{
  CP_DP_PerReaderReleaseTimestepFunc p_Var1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  CPTimestepList p_Var7;
  long lVar8;
  
  pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
  lVar8 = 0;
  do {
    if (Metadata->ReleaseCount <= lVar8) {
      QueueMaintenance(Stream);
      pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
      return;
    }
    p_Var7 = Stream->QueuedTimesteps;
    CP_verbose(Stream,TraceVerbose,"Release List, TS %zd\n",Metadata->ReleaseList[lVar8].Timestep);
    for (; p_Var7 != (CPTimestepList)0x0; p_Var7 = p_Var7->Next) {
      lVar6 = p_Var7->Timestep;
      if (lVar6 == Metadata->ReleaseList[lVar8].Timestep) {
        uVar2 = Stream->ReaderCount;
        if (Stream->ReaderCount < 1) {
          uVar2 = 0;
        }
        uVar3 = (ulong)uVar2;
        for (uVar4 = 0; uVar5 = uVar3, uVar3 != uVar4; uVar4 = uVar4 + 1) {
          if (Stream->Readers[uVar4]->RankZeroID == Metadata->ReleaseList[lVar8].Reader) {
            uVar3 = uVar4 & 0xffffffff;
            uVar5 = uVar4;
            break;
          }
        }
        if (Stream->Readers[uVar5]->LastReleasedTimestep < lVar6) {
          CP_verbose(Stream,TraceVerbose,"Updating reader %d last released to %zd\n",uVar3);
          Stream->Readers[uVar5]->LastReleasedTimestep = p_Var7->Timestep;
          lVar6 = Metadata->ReleaseList[lVar8].Timestep;
        }
        CP_verbose(Stream,TraceVerbose,"Release List, and set ref count of timestep %zd\n",lVar6);
        p_Var1 = Stream->DP_Interface->readerReleaseTimestep;
        if (p_Var1 != (CP_DP_PerReaderReleaseTimestepFunc)0x0) {
          (*p_Var1)(&Svcs,Stream->Readers[uVar5]->DP_WSR_Stream,p_Var7->Timestep);
        }
        p_Var7->ReferenceCount = 0;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static void ProcessReleaseList(SstStream Stream, ReturnMetadataInfo Metadata)
{
    STREAM_MUTEX_LOCK(Stream);
    for (int i = 0; i < Metadata->ReleaseCount; i++)
    {
        CPTimestepList List = Stream->QueuedTimesteps;
        CP_verbose(Stream, TraceVerbose, "Release List, TS %zd\n",
                   Metadata->ReleaseList[i].Timestep);
        while (List)
        {
            if (List->Timestep == Metadata->ReleaseList[i].Timestep)
            {
                /* find local reader that matches global reader and notify local
                 * DP of release */
                int j;
                for (j = 0; j < Stream->ReaderCount; j++)
                {
                    if (Stream->Readers[j]->RankZeroID == Metadata->ReleaseList[i].Reader)
                    {
                        break;
                    }
                }
                assert(j < Stream->ReaderCount);
                if (List->Timestep > Stream->Readers[j]->LastReleasedTimestep)
                {
                    CP_verbose(Stream, TraceVerbose, "Updating reader %d last released to %zd\n", j,
                               List->Timestep);
                    Stream->Readers[j]->LastReleasedTimestep = List->Timestep;
                }
                CP_verbose(Stream, TraceVerbose,
                           "Release List, and set ref count of timestep %zd\n",
                           Metadata->ReleaseList[i].Timestep);
                /* per reader release here */
                if (Stream->DP_Interface->readerReleaseTimestep)
                {
                    (Stream->DP_Interface->readerReleaseTimestep)(
                        &Svcs, Stream->Readers[j]->DP_WSR_Stream, List->Timestep);
                }

                List->ReferenceCount = 0;
            }
            List = List->Next;
        }
    }
    QueueMaintenance(Stream);
    STREAM_MUTEX_UNLOCK(Stream);
}